

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  CacheEntryType CVar5;
  long lVar6;
  char *pcVar7;
  ostream *poVar8;
  pointer pbVar9;
  string *psVar10;
  uint uVar11;
  ulong uVar12;
  CacheEntryType type;
  string entryPattern;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entriesToDelete;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  string path;
  string arg;
  
  uVar12 = 1;
  bVar4 = false;
  do {
    uVar11 = (uint)uVar12;
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5) <= uVar12) {
      if (!bVar4) {
        return true;
      }
      bVar4 = FindPackage(this,args);
      return bVar4;
    }
    std::__cxx11::string::string((string *)&arg,(string *)(pbVar9 + uVar12));
    lVar6 = std::__cxx11::string::find((char *)&arg,0x47b977);
    if (lVar6 == 0) {
      std::__cxx11::string::substr((ulong)&path,(ulong)&arg);
      if (path._M_string_length == 0) {
        uVar11 = uVar11 + 1;
        if ((ulong)uVar11 <
            (ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5)) {
          std::__cxx11::string::_M_assign((string *)&path);
          goto LAB_00275850;
        }
        bVar3 = false;
        cmSystemTools::Error
                  ("-D must be followed with VAR=VALUE.",(char *)0x0,(char *)0x0,(char *)0x0);
      }
      else {
LAB_00275850:
        entryPattern._M_dataplus._M_p = (pointer)&entryPattern.field_2;
        entryPattern._M_string_length = 0;
        entriesToDelete.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&entriesToDelete.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        entriesToDelete.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        entryPattern.field_2._M_local_buf[0] = '\0';
        entriesToDelete.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)entriesToDelete.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        type = UNINITIALIZED;
        bVar3 = cmCacheManager::ParseEntry(&path,&entryPattern,(string *)&entriesToDelete,&type);
        if (bVar3) {
          cacheKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&cacheKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          cacheKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          cacheKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          if ((this->WarnUnusedCli == true) &&
             (pcVar7 = cmState::GetInitializedCacheValue(this->State,&entryPattern),
             pcVar7 != (char *)0x0)) {
            bVar2 = true;
            std::__cxx11::string::assign((char *)&cacheKeys);
          }
          else {
            bVar2 = false;
          }
          cmState::AddCacheEntry
                    (this->State,&entryPattern,
                     (char *)entriesToDelete.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                     "No help, variable specified on the command line.",type);
          if (this->WarnUnusedCli == true) {
            if (bVar2) {
              pcVar7 = cmState::GetInitializedCacheValue(this->State,&entryPattern);
              bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&cacheKeys,pcVar7);
              if (!bVar2) goto LAB_002759ba;
            }
            WatchUnusedCli(this,&entryPattern);
          }
LAB_002759ba:
          std::__cxx11::string::~string((string *)&cacheKeys);
        }
        else {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Parse error in command line argument: ");
          poVar8 = std::operator<<(poVar8,(string *)&arg);
          poVar8 = std::operator<<(poVar8,"\n");
          std::operator<<(poVar8,"Should be: VAR:type=value\n");
          cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        std::__cxx11::string::~string((string *)&entriesToDelete);
        std::__cxx11::string::~string((string *)&entryPattern);
      }
      std::__cxx11::string::~string((string *)&path);
      if (bVar3 != false) goto LAB_00275ca3;
      bVar3 = false;
    }
    else {
      lVar6 = std::__cxx11::string::find((char *)&arg,0x465739);
      if (lVar6 == 0) {
        this->SuppressDevWarnings = true;
        this->DoSuppressDevWarnings = true;
      }
      else {
        lVar6 = std::__cxx11::string::find((char *)&arg,0x46575f);
        if (lVar6 != 0) {
          lVar6 = std::__cxx11::string::find((char *)&arg,0x467b4e);
          if (lVar6 == 0) {
            std::__cxx11::string::substr((ulong)&entryPattern,(ulong)&arg);
            if (entryPattern._M_string_length == 0) {
              uVar11 = uVar11 + 1;
              if ((ulong)uVar11 <
                  (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5)) {
                std::__cxx11::string::_M_assign((string *)&entryPattern);
                goto LAB_00275a42;
              }
              bVar3 = false;
              cmSystemTools::Error
                        ("-U must be followed with VAR.",(char *)0x0,(char *)0x0,(char *)0x0);
            }
            else {
LAB_00275a42:
              cmsys::Glob::PatternToRegex((string *)&entriesToDelete,&entryPattern,true,true);
              cmsys::RegularExpression::RegularExpression
                        ((RegularExpression *)&path,
                         (char *)entriesToDelete.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
              std::__cxx11::string::~string((string *)&entriesToDelete);
              entriesToDelete.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              entriesToDelete.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              entriesToDelete.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmState::GetCacheEntryKeys_abi_cxx11_(&cacheKeys,this->State);
              for (pbVar9 = cacheKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  psVar10 = entriesToDelete.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  pbVar9 != cacheKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
                CVar5 = cmState::GetCacheEntryType(this->State,pbVar9);
                if ((CVar5 != STATIC) &&
                   (bVar3 = cmsys::RegularExpression::find
                                      ((RegularExpression *)&path,(pbVar9->_M_dataplus)._M_p), bVar3
                   )) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&entriesToDelete,pbVar9);
                }
              }
              for (; psVar10 !=
                     entriesToDelete.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; psVar10 = psVar10 + 1) {
                cmState::RemoveCacheEntry(this->State,psVar10);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&cacheKeys);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&entriesToDelete);
              cmsys::RegularExpression::~RegularExpression((RegularExpression *)&path);
              bVar3 = true;
            }
            psVar10 = &entryPattern;
LAB_00275bc8:
            std::__cxx11::string::~string((string *)psVar10);
            if (bVar3) goto LAB_00275ca3;
LAB_00275bd6:
            bVar3 = false;
          }
          else {
            lVar6 = std::__cxx11::string::find((char *)&arg,0x467b6f);
            if (lVar6 == 0) {
              std::__cxx11::string::substr((ulong)&path,(ulong)&arg);
              if (path._M_string_length == 0) {
                uVar11 = uVar11 + 1;
                if ((ulong)uVar11 <
                    (ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5)) {
                  std::__cxx11::string::_M_assign((string *)&path);
                  goto LAB_00275b81;
                }
                bVar3 = false;
                cmSystemTools::Error
                          ("-C must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0
                          );
              }
              else {
LAB_00275b81:
                poVar8 = std::operator<<((ostream *)&std::cout,"loading initial cache file ");
                poVar8 = std::operator<<(poVar8,(string *)&path);
                std::operator<<(poVar8,"\n");
                bVar3 = true;
                ReadListFile(this,args,path._M_dataplus._M_p);
              }
              psVar10 = &path;
              goto LAB_00275bc8;
            }
            lVar6 = std::__cxx11::string::find((char *)&arg,0x467bb2);
            if (lVar6 != 0) {
              lVar6 = std::__cxx11::string::find((char *)&arg,0x467bd9);
              bVar4 = (bool)(bVar4 | lVar6 == 0);
              goto LAB_00275ca3;
            }
            uVar11 = uVar11 + 1;
            pbVar9 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)uVar11 <
                (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5)) {
              std::__cxx11::string::string((string *)&path,(string *)(pbVar9 + uVar11));
              sVar1 = path._M_string_length;
              if (path._M_string_length == 0) {
                cmSystemTools::Error
                          ("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
              }
              else {
                ReadListFile(this,args,path._M_dataplus._M_p);
              }
              std::__cxx11::string::~string((string *)&path);
              if (sVar1 != 0) goto LAB_00275ca3;
              goto LAB_00275bd6;
            }
            bVar3 = false;
            cmSystemTools::Error
                      ("-P must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          goto LAB_00275ca6;
        }
        this->SuppressDevWarnings = false;
        this->DoSuppressDevWarnings = true;
      }
LAB_00275ca3:
      bVar3 = true;
    }
LAB_00275ca6:
    std::__cxx11::string::~string((string *)&arg);
    uVar12 = (ulong)(uVar11 + 1);
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  bool findPackageMode = false;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-D",0) == 0)
      {
      std::string entry = arg.substr(2);
      if(entry.empty())
        {
        ++i;
        if(i < args.size())
          {
          entry = args[i];
          }
        else
          {
          cmSystemTools::Error("-D must be followed with VAR=VALUE.");
          return false;
          }
        }
      std::string var, value;
      cmState::CacheEntryType type = cmState::UNINITIALIZED;
      if(cmCacheManager::ParseEntry(entry, var, value, type))
        {
        // The value is transformed if it is a filepath for example, so
        // we can't compare whether the value is already in the cache until
        // after we call AddCacheEntry.
        bool haveValue = false;
        std::string cachedValue;
        if(this->WarnUnusedCli)
          {
          if(const char *v = this->State->GetInitializedCacheValue(var))
            {
            haveValue = true;
            cachedValue = v;
            }
          }

        this->State->AddCacheEntry(var, value.c_str(),
          "No help, variable specified on the command line.", type);

        if(this->WarnUnusedCli)
          {
          if (!haveValue ||
              cachedValue != this->State->GetInitializedCacheValue(var))
            {
            this->WatchUnusedCli(var);
            }
          }
        }
      else
        {
        std::cerr << "Parse error in command line argument: " << arg << "\n"
                  << "Should be: VAR:type=value\n";
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      }
    else if(arg.find("-Wno-dev",0) == 0)
      {
      this->SuppressDevWarnings = true;
      this->DoSuppressDevWarnings = true;
      }
    else if(arg.find("-Wdev",0) == 0)
      {
      this->SuppressDevWarnings = false;
      this->DoSuppressDevWarnings = true;
      }
    else if(arg.find("-U",0) == 0)
      {
      std::string entryPattern = arg.substr(2);
      if(entryPattern.empty())
        {
        ++i;
        if(i < args.size())
          {
          entryPattern = args[i];
          }
        else
          {
          cmSystemTools::Error("-U must be followed with VAR.");
          return false;
          }
        }
      cmsys::RegularExpression regex(
        cmsys::Glob::PatternToRegex(entryPattern, true, true).c_str());
      //go through all cache entries and collect the vars which will be removed
      std::vector<std::string> entriesToDelete;
      std::vector<std::string> cacheKeys = this->State->GetCacheEntryKeys();
      for (std::vector<std::string>::const_iterator it = cacheKeys.begin();
            it != cacheKeys.end(); ++it)
        {
        cmState::CacheEntryType t = this->State->GetCacheEntryType(*it);
        if(t != cmState::STATIC)
          {
          if (regex.find(it->c_str()))
            {
            entriesToDelete.push_back(*it);
            }
          }
        }

      // now remove them from the cache
      for(std::vector<std::string>::const_iterator currentEntry =
          entriesToDelete.begin();
          currentEntry != entriesToDelete.end();
          ++currentEntry)
        {
        this->State->RemoveCacheEntry(*currentEntry);
        }
      }
    else if(arg.find("-C",0) == 0)
      {
      std::string path = arg.substr(2);
      if (path.empty())
        {
        ++i;
        if(i < args.size())
          {
          path = args[i];
          }
        else
          {
          cmSystemTools::Error("-C must be followed by a file name.");
          return false;
          }
        }
      std::cout << "loading initial cache file " << path << "\n";
      this->ReadListFile(args, path.c_str());
      }
    else if(arg.find("-P",0) == 0)
      {
      i++;
      if(i >= args.size())
        {
        cmSystemTools::Error("-P must be followed by a file name.");
        return false;
        }
      std::string path = args[i];
      if (path.empty())
        {
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      this->ReadListFile(args, path.c_str());
      }
    else if (arg.find("--find-package",0) == 0)
      {
      findPackageMode = true;
      }
    }

  if (findPackageMode)
    {
    return this->FindPackage(args);
    }

  return true;
}